

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode InitiateTransfer(connectdata *conn)

{
  Curl_easy *data;
  CURLcode CVar1;
  curl_off_t size;
  int sockindex;
  int writesockindex;
  
  data = conn->data;
  if (((conn->bits).field_0x6 & 8) != 0) {
    Curl_infof(data,"Doing the SSL/TLS handshake on the data stream\n");
    CVar1 = Curl_ssl_connect(conn,1);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  if ((conn->proto).ftpc.state_saved == FTP_STOR) {
    Curl_pgrsSetUploadSize(data,(data->state).infilesize);
    sockindex = -1;
    size = -1;
    writesockindex = 1;
  }
  else {
    size = (conn->proto).ftpc.retr_size_saved;
    sockindex = 1;
    writesockindex = -1;
  }
  Curl_setup_transfer(data,sockindex,size,false,writesockindex);
  (conn->proto).sshc.authed = true;
  (conn->proto).ftpc.state = FTP_STOP;
  return CURLE_OK;
}

Assistant:

static CURLcode InitiateTransfer(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;

  if(conn->bits.ftp_use_data_ssl) {
    /* since we only have a plaintext TCP connection here, we must now
     * do the TLS stuff */
    infof(data, "Doing the SSL/TLS handshake on the data stream\n");
    result = Curl_ssl_connect(conn, SECONDARYSOCKET);
    if(result)
      return result;
  }

  if(conn->proto.ftpc.state_saved == FTP_STOR) {
    /* When we know we're uploading a specified file, we can get the file
       size prior to the actual upload. */
    Curl_pgrsSetUploadSize(data, data->state.infilesize);

    /* set the SO_SNDBUF for the secondary socket for those who need it */
    Curl_sndbufset(conn->sock[SECONDARYSOCKET]);

    Curl_setup_transfer(data, -1, -1, FALSE, SECONDARYSOCKET);
  }
  else {
    /* FTP download: */
    Curl_setup_transfer(data, SECONDARYSOCKET,
                        conn->proto.ftpc.retr_size_saved, FALSE, -1);
  }

  conn->proto.ftpc.pp.pending_resp = TRUE; /* expect server response */
  state(conn, FTP_STOP);

  return CURLE_OK;
}